

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O3

double average_time<xorshf64>(xorshf64 *generator,size_t trials,size_t times)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  timer elapsed;
  timer local_30;
  
  if (trials == 0) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    sVar2 = trials;
    do {
      timer::timer(&local_30);
      single_run<xorshf64>(generator,times);
      dVar3 = timer::elapsed(&local_30);
      sVar2 = sVar2 - 1;
      dVar5 = dVar5 + dVar3;
    } while (sVar2 != 0);
  }
  lVar1 = times * trials;
  auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar4._0_8_ = lVar1;
  auVar4._12_4_ = 0x45300000;
  return (((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * 1e-06) / dVar5;
}

Assistant:

double average_time(G& generator, size_t trials, size_t times ) {
    double average_time = 0.0;

    for ( size_t i = 0; i < trials; ++i ) {
        timer elapsed;
        single_run( generator, times );
        average_time += elapsed.elapsed();
    }

    return trials * times / average_time / 1000000.0;
}